

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O3

int register_pmeth_gost(int id,EVP_PKEY_METHOD **pmeth,int flags)

{
  EVP_PKEY_METHOD *pmeth_00;
  code *pcVar1;
  EVP_PKEY_METHOD *pmeth_01;
  code *pcVar2;
  code *pcVar3;
  
  pmeth_00 = EVP_PKEY_meth_new(id,flags);
  *pmeth = (EVP_PKEY_METHOD *)pmeth_00;
  if (pmeth_00 == (EVP_PKEY_METHOD *)0x0) {
    return 0;
  }
  pcVar1 = pkey_gost_ec_ctrl_str_256;
  if (id < 0x3d3) {
    pcVar2 = pkey_gost2001_paramgen;
    pcVar3 = pkey_gost2001cp_keygen;
    if (id < 0x331) {
      if (id != 0x32b) {
        if (id != 0x32f) {
          return 0;
        }
        EVP_PKEY_meth_set_ctrl(pmeth_00,pkey_gost_mac_ctrl,pkey_gost_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx
                  ((EVP_PKEY_METHOD *)*pmeth,pkey_gost_mac_signctx_init,pkey_gost_mac_signctx);
        pmeth_01 = *pmeth;
        pcVar1 = pkey_gost_mac_keygen;
LAB_001107aa:
        EVP_PKEY_meth_set_keygen((EVP_PKEY_METHOD *)pmeth_01,(keygen_init *)0x0,pcVar1);
        pcVar2 = pkey_gost_mac_copy;
        pcVar3 = pkey_gost_mac_cleanup;
        pcVar1 = pkey_gost_mac_init;
        goto LAB_0011091a;
      }
    }
    else if (id != 0x331) {
      if (id != 0x3d0) {
        return 0;
      }
      EVP_PKEY_meth_set_ctrl(pmeth_00,pkey_gost_mac_ctrl,pkey_gost_mac_ctrl_str);
      EVP_PKEY_meth_set_signctx
                ((EVP_PKEY_METHOD *)*pmeth,pkey_gost_mac_signctx_init,pkey_gost_mac_signctx);
      pmeth_01 = *pmeth;
      pcVar1 = pkey_gost_mac_keygen_12;
      goto LAB_001107aa;
    }
  }
  else {
    if (0x3f8 < id) {
      if ((id == 0x3f9) || (id == 0x49a)) {
        EVP_PKEY_meth_set_ctrl
                  (pmeth_00,pkey_gost_grasshopper_mac_ctrl,pkey_gost_grasshopper_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx
                  ((EVP_PKEY_METHOD *)*pmeth,pkey_gost_grasshopper_mac_signctx_init,
                   pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen
                  ((EVP_PKEY_METHOD *)*pmeth,(keygen_init *)0x0,pkey_gost_grasshopper_mac_keygen);
        pcVar2 = pkey_gost_mac_copy;
        pcVar3 = pkey_gost_mac_cleanup;
        pcVar1 = pkey_gost_grasshopper_mac_init;
      }
      else {
        if (id != 0x4a8) {
          return 0;
        }
        EVP_PKEY_meth_set_ctrl(pmeth_00,pkey_gost_magma_mac_ctrl,pkey_gost_magma_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx
                  ((EVP_PKEY_METHOD *)*pmeth,pkey_gost_magma_mac_signctx_init,pkey_gost_mac_signctx)
        ;
        EVP_PKEY_meth_set_keygen
                  ((EVP_PKEY_METHOD *)*pmeth,(keygen_init *)0x0,pkey_gost_magma_mac_keygen);
        pcVar2 = pkey_gost_mac_copy;
        pcVar3 = pkey_gost_mac_cleanup;
        pcVar1 = pkey_gost_magma_mac_init;
      }
      goto LAB_0011091a;
    }
    if (id == 0x3d3) {
      pcVar2 = pkey_gost2012_paramgen;
      pcVar3 = pkey_gost2012cp_keygen;
    }
    else {
      if (id != 0x3d4) {
        return 0;
      }
      pcVar2 = pkey_gost2012_paramgen;
      pcVar3 = pkey_gost2012cp_keygen;
      pcVar1 = pkey_gost_ec_ctrl_str_512;
    }
  }
  EVP_PKEY_meth_set_ctrl(pmeth_00,pkey_gost_ctrl,pcVar1);
  EVP_PKEY_meth_set_sign((EVP_PKEY_METHOD *)*pmeth,(sign_init *)0x0,pkey_gost_ec_cp_sign);
  EVP_PKEY_meth_set_verify((EVP_PKEY_METHOD *)*pmeth,(verify_init *)0x0,pkey_gost_ec_cp_verify);
  EVP_PKEY_meth_set_keygen((EVP_PKEY_METHOD *)*pmeth,(keygen_init *)0x0,pcVar3);
  EVP_PKEY_meth_set_encrypt((EVP_PKEY_METHOD *)*pmeth,pkey_gost_encrypt_init,pkey_gost_encrypt);
  EVP_PKEY_meth_set_decrypt((EVP_PKEY_METHOD *)*pmeth,(decrypt_init *)0x0,pkey_gost_decrypt);
  EVP_PKEY_meth_set_derive((EVP_PKEY_METHOD *)*pmeth,pkey_gost_derive_init,pkey_gost_ec_derive);
  EVP_PKEY_meth_set_paramgen((EVP_PKEY_METHOD *)*pmeth,pkey_gost_paramgen_init,pcVar2);
  EVP_PKEY_meth_set_check(*pmeth,pkey_gost_check);
  EVP_PKEY_meth_set_public_check(*pmeth,pkey_gost_check);
  pcVar2 = pkey_gost_copy;
  pcVar3 = pkey_gost_cleanup;
  pcVar1 = pkey_gost_init;
LAB_0011091a:
  EVP_PKEY_meth_set_init((EVP_PKEY_METHOD *)*pmeth,pcVar1);
  EVP_PKEY_meth_set_cleanup((EVP_PKEY_METHOD *)*pmeth,pcVar3);
  EVP_PKEY_meth_set_copy((EVP_PKEY_METHOD *)*pmeth,pcVar2);
  return 1;
}

Assistant:

int register_pmeth_gost(int id, EVP_PKEY_METHOD **pmeth, int flags)
{
    *pmeth = EVP_PKEY_meth_new(id, flags);
    if (!*pmeth)
        return 0;

    switch (id) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        EVP_PKEY_meth_set_ctrl(*pmeth,
                               pkey_gost_ctrl, pkey_gost_ec_ctrl_str_256);
        EVP_PKEY_meth_set_sign(*pmeth, NULL, pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify(*pmeth, NULL, pkey_gost_ec_cp_verify);

        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost2001cp_keygen);

        EVP_PKEY_meth_set_encrypt(*pmeth,
                                  pkey_gost_encrypt_init,
                                  pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt(*pmeth, NULL, pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive(*pmeth,
                                 pkey_gost_derive_init, pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen(*pmeth, pkey_gost_paramgen_init,
                                   pkey_gost2001_paramgen);
    EVP_PKEY_meth_set_check(*pmeth, pkey_gost_check);
    EVP_PKEY_meth_set_public_check(*pmeth, pkey_gost_check);
        break;
    case NID_id_GostR3410_2012_256:
        EVP_PKEY_meth_set_ctrl(*pmeth,
                               pkey_gost_ctrl, pkey_gost_ec_ctrl_str_256);
        EVP_PKEY_meth_set_sign(*pmeth, NULL, pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify(*pmeth, NULL, pkey_gost_ec_cp_verify);

        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost2012cp_keygen);

        EVP_PKEY_meth_set_encrypt(*pmeth,
                                  pkey_gost_encrypt_init,
                                  pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt(*pmeth, NULL, pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive(*pmeth,
                                 pkey_gost_derive_init, pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen(*pmeth,
                                   pkey_gost_paramgen_init,
                                   pkey_gost2012_paramgen);
    EVP_PKEY_meth_set_check(*pmeth, pkey_gost_check);
    EVP_PKEY_meth_set_public_check(*pmeth, pkey_gost_check);
        break;
    case NID_id_GostR3410_2012_512:
        EVP_PKEY_meth_set_ctrl(*pmeth,
                               pkey_gost_ctrl, pkey_gost_ec_ctrl_str_512);
        EVP_PKEY_meth_set_sign(*pmeth, NULL, pkey_gost_ec_cp_sign);
        EVP_PKEY_meth_set_verify(*pmeth, NULL, pkey_gost_ec_cp_verify);

        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost2012cp_keygen);

        EVP_PKEY_meth_set_encrypt(*pmeth,
                                  pkey_gost_encrypt_init,
                                  pkey_gost_encrypt);
        EVP_PKEY_meth_set_decrypt(*pmeth, NULL, pkey_gost_decrypt);
        EVP_PKEY_meth_set_derive(*pmeth,
                                 pkey_gost_derive_init, pkey_gost_ec_derive);
        EVP_PKEY_meth_set_paramgen(*pmeth,
                                   pkey_gost_paramgen_init,
                                   pkey_gost2012_paramgen);
    EVP_PKEY_meth_set_check(*pmeth, pkey_gost_check);
    EVP_PKEY_meth_set_public_check(*pmeth, pkey_gost_check);
        break;
    case NID_id_Gost28147_89_MAC:
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_mac_ctrl,
                               pkey_gost_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_mac_keygen);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    case NID_gost_mac_12:
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_mac_ctrl,
                               pkey_gost_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_mac_keygen_12);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    case NID_magma_mac:
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_magma_mac_ctrl,
                               pkey_gost_magma_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_magma_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_magma_mac_keygen);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_magma_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    case NID_grasshopper_mac:
    case NID_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac: /* FIXME beldmit */
        EVP_PKEY_meth_set_ctrl(*pmeth, pkey_gost_grasshopper_mac_ctrl,
                               pkey_gost_grasshopper_mac_ctrl_str);
        EVP_PKEY_meth_set_signctx(*pmeth, pkey_gost_grasshopper_mac_signctx_init,
                                  pkey_gost_mac_signctx);
        EVP_PKEY_meth_set_keygen(*pmeth, NULL, pkey_gost_grasshopper_mac_keygen);
        EVP_PKEY_meth_set_init(*pmeth, pkey_gost_grasshopper_mac_init);
        EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_mac_cleanup);
        EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_mac_copy);
        return 1;
    default:                   /* Unsupported method */
        return 0;
    }
    EVP_PKEY_meth_set_init(*pmeth, pkey_gost_init);
    EVP_PKEY_meth_set_cleanup(*pmeth, pkey_gost_cleanup);

    EVP_PKEY_meth_set_copy(*pmeth, pkey_gost_copy);
    /*
     * FIXME derive etc...
     */

    return 1;
}